

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<Catch::Config> * __thiscall
Catch::Ptr<Catch::Config>::operator=(Ptr<Catch::Config> *this,Config *p)

{
  Config *in_RDI;
  Ptr<Catch::Config> temp;
  Ptr<Catch::Config> *this_00;
  Ptr<Catch::Config> local_18 [3];
  
  this_00 = local_18;
  Ptr(this_00,in_RDI);
  swap(this_00,(Ptr<Catch::Config> *)in_RDI);
  ~Ptr(this_00);
  return (Ptr<Catch::Config> *)in_RDI;
}

Assistant:

Ptr& operator = ( T* p ){
            Ptr temp( p );
            swap( temp );
            return *this;
        }